

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create.cpp
# Opt level: O2

bool __thiscall create::Create::setMode(Create *this,CreateMode *mode)

{
  bool bVar1;
  ProtocolVersion PVar2;
  undefined8 in_RAX;
  ostream *poVar3;
  char *pcVar4;
  element_type *this_00;
  undefined8 local_18;
  
  local_18 = in_RAX;
  PVar2 = RobotModel::getVersion(&this->model);
  if (PVar2 == V_1) {
    local_18 = CONCAT44(local_18._4_4_,0x80);
    bVar1 = Serial::sendOpcode((this->serial).
                               super___shared_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                               ,(Opcode *)&local_18);
    if (!bVar1) {
      return false;
    }
    local_18 = CONCAT44(0x82,(Opcode)local_18);
    bVar1 = Serial::sendOpcode((this->serial).
                               super___shared_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                               ,(Opcode *)((long)&local_18 + 4));
    if (!bVar1) {
      return false;
    }
  }
  switch(*mode) {
  case MODE_OFF:
    PVar2 = RobotModel::getVersion(&this->model);
    if (PVar2 == V_2) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"[create::Create] ");
      pcVar4 = "protocol version 2 does not support turning robot off";
      goto LAB_00143fef;
    }
    this_00 = (this->serial).super___shared_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_18 = CONCAT44(local_18._4_4_,0x85);
    break;
  case MODE_PASSIVE:
    this_00 = (this->serial).super___shared_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_18 = CONCAT44(local_18._4_4_,0x80);
    break;
  case MODE_SAFE:
    PVar2 = RobotModel::getVersion(&this->model);
    if (PVar2 < V_2) {
      return false;
    }
    this_00 = (this->serial).super___shared_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_18 = CONCAT44(local_18._4_4_,0x83);
    break;
  case MODE_FULL:
    this_00 = (this->serial).super___shared_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_18 = CONCAT44(local_18._4_4_,0x84);
    break;
  default:
    poVar3 = std::operator<<((ostream *)&std::cerr,"[create::Create] ");
    poVar3 = std::operator<<(poVar3,"cannot set robot to mode \'");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*mode);
    pcVar4 = "\'";
LAB_00143fef:
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::endl<char,std::char_traits<char>>(poVar3);
    return false;
  }
  bVar1 = Serial::sendOpcode(this_00,(Opcode *)&local_18);
  if (!bVar1) {
    return false;
  }
  this->mode = *mode;
  return true;
}

Assistant:

bool Create::setMode(const CreateMode& mode) {
    if (model.getVersion() == V_1){
      // Switch to safe mode (required for compatibility with V_1)
      if (!(serial->sendOpcode(OC_START) && serial->sendOpcode(OC_CONTROL))) return false;
    }
    bool ret = false;
    switch (mode) {
      case MODE_OFF:
        if (model.getVersion() == V_2) {
          CERR("[create::Create] ", "protocol version 2 does not support turning robot off");
          ret = false;
        } else {
          ret = serial->sendOpcode(OC_POWER);
        }
        break;
      case MODE_PASSIVE:
        ret = serial->sendOpcode(OC_START);
        break;
      case MODE_SAFE:
        if (model.getVersion() > V_1) {
          ret = serial->sendOpcode(OC_SAFE);
        }
        break;
      case MODE_FULL:
        ret = serial->sendOpcode(OC_FULL);
        break;
      default:
        CERR("[create::Create] ", "cannot set robot to mode '" << mode << "'");
        ret = false;
    }
    if (ret) {
      this->mode = mode;
    }
    return ret;
  }